

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void set_time_915(uchar *p,time_t t)

{
  undefined1 local_50 [8];
  tm_conflict tm;
  time_t t_local;
  uchar *p_local;
  
  tm.tm_zone = (char *)t;
  get_tmfromtime((tm_conflict *)local_50,(time_t *)&tm.tm_zone);
  set_num_711(p,(uchar)tm.tm_mday);
  set_num_711(p + 1,(char)tm.tm_hour + '\x01');
  set_num_711(p + 2,(uchar)tm.tm_min);
  set_num_711(p + 3,(uchar)tm.tm_sec);
  set_num_711(p + 4,local_50[4]);
  set_num_711(p + 5,local_50[0]);
  set_num_712(p + 6,(char)((long)tm._32_8_ / 900));
  return;
}

Assistant:

static void
set_time_915(unsigned char *p, time_t t)
{
	struct tm tm;

	get_tmfromtime(&tm, &t);
	set_num_711(p+0, tm.tm_year);
	set_num_711(p+1, tm.tm_mon+1);
	set_num_711(p+2, tm.tm_mday);
	set_num_711(p+3, tm.tm_hour);
	set_num_711(p+4, tm.tm_min);
	set_num_711(p+5, tm.tm_sec);
	set_num_712(p+6, (char)(get_gmoffset(&tm)/(60*15)));
}